

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O1

SUNLinearSolver SUNLinSol_SPTFQMR(N_Vector y,int pretype,int maxl,SUNContext_conflict sunctx)

{
  SUNLinearSolver_Ops p_Var1;
  SUNLinearSolver p_Var2;
  int *piVar3;
  undefined8 uVar4;
  int iVar5;
  
  if (3 < (uint)pretype) {
    pretype = 0;
  }
  iVar5 = 5;
  if (0 < maxl) {
    iVar5 = maxl;
  }
  p_Var2 = (SUNLinearSolver)SUNLinSolNewEmpty(sunctx);
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNLinSolGetType_SPTFQMR;
  p_Var1->getid = SUNLinSolGetID_SPTFQMR;
  p_Var1->setatimes = SUNLinSolSetATimes_SPTFQMR;
  p_Var1->setpreconditioner = SUNLinSolSetPreconditioner_SPTFQMR;
  p_Var1->setscalingvectors = SUNLinSolSetScalingVectors_SPTFQMR;
  p_Var1->setzeroguess = SUNLinSolSetZeroGuess_SPTFQMR;
  p_Var1->initialize = SUNLinSolInitialize_SPTFQMR;
  p_Var1->setup = SUNLinSolSetup_SPTFQMR;
  p_Var1->solve = SUNLinSolSolve_SPTFQMR;
  p_Var1->numiters = SUNLinSolNumIters_SPTFQMR;
  p_Var1->resnorm = SUNLinSolResNorm_SPTFQMR;
  p_Var1->resid = SUNLinSolResid_SPTFQMR;
  p_Var1->lastflag = SUNLinSolLastFlag_SPTFQMR;
  p_Var1->space = SUNLinSolSpace_SPTFQMR;
  p_Var1->free = SUNLinSolFree_SPTFQMR;
  piVar3 = (int *)malloc(0xa8);
  p_Var2->content = piVar3;
  piVar3[6] = 0;
  *piVar3 = iVar5;
  piVar3[1] = pretype;
  piVar3[2] = 0;
  piVar3[3] = 0;
  piVar3[4] = 0;
  piVar3[5] = 0;
  memset(piVar3 + 8,0,0x88);
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x16) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x18) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1a) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1c) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x1e) = uVar4;
  uVar4 = N_VCloneVectorArray(2,y);
  *(undefined8 *)(piVar3 + 0x20) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x22) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x24) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x26) = uVar4;
  uVar4 = N_VClone(y);
  *(undefined8 *)(piVar3 + 0x28) = uVar4;
  return p_Var2;
}

Assistant:

SUNLinearSolver SUNLinSol_SPTFQMR(N_Vector y, int pretype, int maxl,
                                  SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_SPTFQMR content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE) && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
  {
    pretype = SUN_PREC_NONE;
  }
  if (maxl <= 0) { maxl = SUNSPTFQMR_MAXL_DEFAULT; }

  /* check that the supplied N_Vector supports all requisite operations */
  SUNAssertNull((y->ops->nvclone) && (y->ops->nvdestroy) &&
                  (y->ops->nvlinearsum) && (y->ops->nvconst) && (y->ops->nvprod) &&
                  (y->ops->nvdiv) && (y->ops->nvscale) && (y->ops->nvdotprod),
                SUN_ERR_ARG_INCOMPATIBLE);

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_SPTFQMR;
  S->ops->getid             = SUNLinSolGetID_SPTFQMR;
  S->ops->setatimes         = SUNLinSolSetATimes_SPTFQMR;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPTFQMR;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPTFQMR;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_SPTFQMR;
  S->ops->initialize        = SUNLinSolInitialize_SPTFQMR;
  S->ops->setup             = SUNLinSolSetup_SPTFQMR;
  S->ops->solve             = SUNLinSolSolve_SPTFQMR;
  S->ops->numiters          = SUNLinSolNumIters_SPTFQMR;
  S->ops->resnorm           = SUNLinSolResNorm_SPTFQMR;
  S->ops->resid             = SUNLinSolResid_SPTFQMR;
  S->ops->lastflag          = SUNLinSolLastFlag_SPTFQMR;
  S->ops->space             = SUNLinSolSpace_SPTFQMR;
  S->ops->free              = SUNLinSolFree_SPTFQMR;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPTFQMR)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->last_flag = 0;
  content->maxl      = maxl;
  content->pretype   = pretype;
  content->zeroguess = SUNFALSE;
  content->numiters  = 0;
  content->resnorm   = ZERO;
  content->r_star    = NULL;
  content->q         = NULL;
  content->d         = NULL;
  content->v         = NULL;
  content->p         = NULL;
  content->r         = NULL;
  content->u         = NULL;
  content->vtemp1    = NULL;
  content->vtemp2    = NULL;
  content->vtemp3    = NULL;
  content->s1        = NULL;
  content->s2        = NULL;
  content->ATimes    = NULL;
  content->ATData    = NULL;
  content->Psetup    = NULL;
  content->Psolve    = NULL;
  content->PData     = NULL;

  /* Allocate content */
  content->r_star = N_VClone(y);
  SUNCheckLastErrNull();
  content->q = N_VClone(y);
  SUNCheckLastErrNull();
  content->d = N_VClone(y);
  SUNCheckLastErrNull();
  content->v = N_VClone(y);
  SUNCheckLastErrNull();
  content->p = N_VClone(y);
  SUNCheckLastErrNull();
  content->r = N_VCloneVectorArray(2, y);
  SUNCheckLastErrNull();
  content->u = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp1 = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp2 = N_VClone(y);
  SUNCheckLastErrNull();
  content->vtemp3 = N_VClone(y);
  SUNCheckLastErrNull();

  return (S);
}